

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O2

QList<int> * __thiscall
QPlatformFontDatabase::standardSizes(QList<int> *__return_storage_ptr__,QPlatformFontDatabase *this)

{
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<int>::reserve(__return_storage_ptr__,0x12);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<QList<int>>>
            ("\x06\a\b\t\n\v\f\x0e\x10\x12\x14\x16\x18\x1a\x1c$0H","",
             (back_insert_iterator<QList<int>_>)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

QList<int> QPlatformFontDatabase::standardSizes() const
{
    QList<int> ret;
    static const quint8 standard[] =
        { 6, 7, 8, 9, 10, 11, 12, 14, 16, 18, 20, 22, 24, 26, 28, 36, 48, 72 };
    static const int num_standards = int(sizeof standard / sizeof *standard);
    ret.reserve(num_standards);
    std::copy(standard, standard + num_standards, std::back_inserter(ret));
    return ret;
}